

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::GridRenderCase::verifyRenderResult
          (GridRenderCase *this,IterationConfig *config)

{
  ostringstream *poVar1;
  float fVar2;
  uint uVar3;
  size_type sVar4;
  RenderContext *context;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  TestLog *pTVar8;
  int iVar9;
  ConstPixelBufferAccess *pCVar10;
  LogImageSet *access;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int iVar11;
  int iVar12;
  int iVar13;
  void *pvVar14;
  int iVar15;
  int iVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  Surface viewportSurface;
  Surface errorMask;
  ProjectedBBox projectedBBox;
  Surface local_4b0;
  Surface local_498;
  string local_480;
  float local_460;
  float local_45c;
  float local_458;
  float local_454;
  float local_450;
  float local_44c;
  float local_448;
  float local_444;
  float local_440;
  float local_43c;
  float local_438;
  float local_434;
  float local_430;
  float local_42c;
  string local_428;
  string local_408;
  long local_3e8;
  TextureFormat local_3e0;
  undefined1 local_3d8 [40];
  undefined1 local_3b0 [40];
  string local_388;
  string local_368;
  string local_348;
  LogImageSet local_328;
  LogImage local_2e8;
  float local_258;
  float local_254;
  float local_250;
  float local_24c;
  float local_248;
  float local_244;
  LogImage local_240;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_3e8 = CONCAT44(extraout_var,iVar5);
  projectBoundingBox(&config->bbox);
  iVar5 = (config->viewportSize).m_data[0];
  iVar6 = (config->viewportSize).m_data[1];
  local_438 = local_258;
  fVar20 = (float)iVar5;
  local_440 = local_254;
  fVar19 = (float)iVar6;
  local_43c = local_24c;
  local_444 = local_248;
  local_42c = floorf((local_258 * 0.5 + 0.5) * fVar20);
  local_430 = floorf((local_254 * 0.5 + 0.5) * fVar19);
  local_434 = ceilf((local_24c * 0.5 + 0.5) * fVar20 + 0.0);
  fVar17 = ceilf((local_248 * 0.5 + 0.5) * fVar19 + 0.0);
  fVar18 = (config->patternPos).m_data[0];
  fVar2 = (config->patternPos).m_data[1];
  fVar21 = (fVar18 * 0.5 + 0.5) * fVar20;
  fVar22 = (fVar2 * 0.5 + 0.5) * fVar19;
  fVar20 = ((fVar18 + (config->patternSize).m_data[0]) * 0.5 + 0.5) * fVar20;
  fVar19 = ((fVar2 + (config->patternSize).m_data[1]) * 0.5 + 0.5) * fVar19;
  local_448 = floorf(fVar21 + -0.5);
  local_44c = floorf(fVar22 + -0.5);
  local_450 = ceilf(fVar20 + 0.5);
  local_454 = ceilf(fVar19 + 0.5);
  fVar18 = ceilf(fVar21 + 0.5);
  local_458 = ceilf(fVar22 + 0.5);
  local_45c = floorf(fVar20 + -0.5);
  local_460 = floorf(fVar19 + -0.5);
  tcu::Surface::Surface(&local_4b0,iVar5,iVar6);
  tcu::Surface::Surface
            (&local_498,(config->viewportSize).m_data[0],(config->viewportSize).m_data[1]);
  iVar11 = (int)local_42c;
  iVar5 = (int)local_430;
  iVar15 = (int)local_434;
  iVar6 = (int)fVar17;
  if (*(char *)((long)&this->m_program + 3) == '\0') {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Projected bounding box: (clip space)\n",0x25);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tx: [",5);
    std::ostream::_M_insert<double>((double)local_438);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
    std::ostream::_M_insert<double>((double)local_43c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\ty: [",5);
    std::ostream::_M_insert<double>((double)local_440);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
    std::ostream::_M_insert<double>((double)local_444);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tz: [",5);
    std::ostream::_M_insert<double>((double)local_250);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
    std::ostream::_M_insert<double>((double)local_244);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"In viewport coordinates:\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tx: [",5);
    std::ostream::operator<<(poVar1,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::operator<<(poVar1,iVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\ty: [",5);
    std::ostream::operator<<(poVar1,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::operator<<(poVar1,iVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Verifying render results within the bounding box.\n",0x32);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"Verifying render result.",0x18);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  sVar4 = this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length;
  if (sVar4 != 0) {
    (**(code **)(local_3e8 + 0x78))(0x8ca8,*(undefined4 *)(sVar4 + 0x10));
  }
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar7 = (config->viewportPos).m_data[0];
  iVar13 = (config->viewportPos).m_data[1];
  local_2e8.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar14 = (void *)local_4b0.m_pixels.m_cap;
  if ((void *)local_4b0.m_pixels.m_cap != (void *)0x0) {
    pvVar14 = local_4b0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_2e8,local_4b0.m_width,
             local_4b0.m_height,1,pvVar14);
  glu::readPixels(context,iVar7,iVar13,(PixelBufferAccess *)local_1b0);
  local_2e8.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar14 = (void *)local_498.m_pixels.m_cap;
  if ((void *)local_498.m_pixels.m_cap != (void *)0x0) {
    pvVar14 = local_498.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_2e8,local_498.m_width,
             local_498.m_height,1,pvVar14);
  local_2e8.m_name._M_dataplus._M_p = (pointer)0x0;
  local_2e8.m_name._M_string_length = 0xff00000000;
  tcu::clear((PixelBufferAccess *)local_1b0,(IVec4 *)&local_2e8);
  iVar7 = 0;
  if (iVar5 < 1) {
    iVar5 = iVar7;
  }
  iVar13 = (config->viewportSize).m_data[1];
  iVar9 = iVar13;
  if (iVar6 < iVar13) {
    iVar9 = iVar6;
  }
  if (iVar5 < iVar9) {
    if (iVar11 < 1) {
      iVar11 = 0;
    }
    iVar9 = (config->viewportSize).m_data[0];
    do {
      iVar12 = iVar9;
      if (iVar15 < iVar9) {
        iVar12 = iVar15;
      }
      iVar16 = iVar11;
      if (iVar11 < iVar12) {
        do {
          uVar3 = *(uint *)((long)local_4b0.m_pixels.m_ptr +
                           (long)(local_4b0.m_width * iVar5 + iVar16) * 4);
          if ((((iVar16 < (int)local_448) || (iVar5 < (int)local_44c)) || ((int)local_450 < iVar16))
             || ((int)local_454 < iVar5)) {
            if ((uVar3 & 0xffffff) != 0) goto LAB_01646fc5;
          }
          else if ((((int)fVar18 < iVar16) && ((int)local_458 < iVar5)) &&
                  ((iVar16 < (int)local_45c &&
                   ((iVar5 < (int)local_460 && ((uVar3 & 0xffff00) != 0xff00)))))) {
LAB_01646fc5:
            *(undefined4 *)
             ((long)local_498.m_pixels.m_ptr + (long)(local_498.m_width * iVar5 + iVar16) * 4) =
                 0xff0000ff;
            iVar9 = (config->viewportSize).m_data[0];
            iVar7 = 1;
          }
          iVar16 = iVar16 + 1;
          iVar13 = iVar9;
          if (iVar15 < iVar9) {
            iVar13 = iVar15;
          }
        } while (iVar16 < iVar13);
        iVar13 = (config->viewportSize).m_data[1];
      }
      iVar5 = iVar5 + 1;
      iVar12 = iVar13;
      if (iVar6 < iVar13) {
        iVar12 = iVar6;
      }
    } while (iVar5 < iVar12);
    if (iVar7 != 0) {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"Image verification failed.",0x1a);
      pTVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"Images","");
      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"Image verification","");
      tcu::LogImageSet::LogImageSet(&local_328,&local_480,&local_428);
      tcu::TestLog::startImageSet
                (pTVar8,local_328.m_name._M_dataplus._M_p,local_328.m_description._M_dataplus._M_p);
      local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"Viewport","");
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"Viewport contents","");
      local_240.m_name._M_dataplus._M_p = (char *)0x300000008;
      if ((void *)local_4b0.m_pixels.m_cap != (void *)0x0) {
        local_4b0.m_pixels.m_cap = (size_t)local_4b0.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_3b0,(TextureFormat *)&local_240,local_4b0.m_width,
                 local_4b0.m_height,1,(void *)local_4b0.m_pixels.m_cap);
      pCVar10 = (ConstPixelBufferAccess *)local_3b0;
      tcu::LogImage::LogImage
                (&local_2e8,&local_408,&local_348,pCVar10,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_2e8,(int)pTVar8,__buf,(size_t)pCVar10);
      local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"ErrorMask","");
      local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"Error mask","");
      local_3e0.order = RGBA;
      local_3e0.type = UNORM_INT8;
      if ((void *)local_498.m_pixels.m_cap != (void *)0x0) {
        local_498.m_pixels.m_cap = (size_t)local_498.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_3d8,&local_3e0,local_498.m_width,local_498.m_height,1,
                 (void *)local_498.m_pixels.m_cap);
      pCVar10 = (ConstPixelBufferAccess *)local_3d8;
      tcu::LogImage::LogImage
                (&local_240,&local_368,&local_388,pCVar10,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_240,(int)pTVar8,__buf_00,(size_t)pCVar10);
      tcu::TestLog::endImageSet(pTVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
        operator_delete(local_240.m_description._M_dataplus._M_p,
                        local_240.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
        operator_delete(local_240.m_name._M_dataplus._M_p,
                        local_240.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8.m_description._M_dataplus._M_p != &local_2e8.m_description.field_2) {
        operator_delete(local_2e8.m_description._M_dataplus._M_p,
                        local_2e8.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8.m_name._M_dataplus._M_p != &local_2e8.m_name.field_2) {
        operator_delete(local_2e8.m_name._M_dataplus._M_p,
                        local_2e8.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
        operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328.m_description._M_dataplus._M_p != &local_328.m_description.field_2) {
        operator_delete(local_328.m_description._M_dataplus._M_p,
                        local_328.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328.m_name._M_dataplus._M_p != &local_328.m_name.field_2) {
        operator_delete(local_328.m_name._M_dataplus._M_p,
                        local_328.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_480._M_dataplus._M_p != &local_480.field_2) {
        operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      std::ios_base::~ios_base(local_138);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Image verification failed");
      goto LAB_016476e6;
    }
  }
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Result image ok.",0x10);
  pTVar8 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_3b0._0_8_ = (long)local_3b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"Images","");
  local_3d8._0_8_ = (long)local_3d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"Image verification","");
  tcu::LogImageSet::LogImageSet((LogImageSet *)&local_240,(string *)local_3b0,(string *)local_3d8);
  tcu::TestLog::startImageSet
            (pTVar8,local_240.m_name._M_dataplus._M_p,local_240.m_description._M_dataplus._M_p);
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"Viewport","");
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"Viewport contents","");
  local_408._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_4b0.m_pixels.m_cap != (void *)0x0) {
    local_4b0.m_pixels.m_cap = (size_t)local_4b0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_328,(TextureFormat *)&local_408,local_4b0.m_width,
             local_4b0.m_height,1,(void *)local_4b0.m_pixels.m_cap);
  access = &local_328;
  tcu::LogImage::LogImage
            (&local_2e8,&local_480,&local_428,(ConstPixelBufferAccess *)access,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write(&local_2e8,(int)pTVar8,__buf_01,(size_t)access);
  tcu::TestLog::endImageSet(pTVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8.m_description._M_dataplus._M_p != &local_2e8.m_description.field_2) {
    operator_delete(local_2e8.m_description._M_dataplus._M_p,
                    local_2e8.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8.m_name._M_dataplus._M_p != &local_2e8.m_name.field_2) {
    operator_delete(local_2e8.m_name._M_dataplus._M_p,
                    local_2e8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
    operator_delete(local_240.m_description._M_dataplus._M_p,
                    local_240.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
    operator_delete(local_240.m_name._M_dataplus._M_p,
                    local_240.m_name.field_2._M_allocated_capacity + 1);
  }
  if (local_3d8._0_8_ != (long)local_3d8 + 0x10) {
    operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
  }
  if (local_3b0._0_8_ != (long)local_3b0 + 0x10) {
    operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
LAB_016476e6:
  tcu::Surface::~Surface(&local_498);
  tcu::Surface::~Surface(&local_4b0);
  return;
}

Assistant:

void GridRenderCase::verifyRenderResult (const IterationConfig& config)
{
	const glw::Functions&	gl						= m_context.getRenderContext().getFunctions();
	const ProjectedBBox		projectedBBox			= projectBoundingBox(config.bbox);
	const tcu::IVec4		viewportBBoxArea		= getViewportBoundingBoxArea(projectedBBox, config.viewportSize);
	const tcu::IVec4		viewportGridOuterArea	= getViewportPatternArea(config.patternPos, config.patternSize, config.viewportSize, ROUND_OUTWARDS);
	const tcu::IVec4		viewportGridInnerArea	= getViewportPatternArea(config.patternPos, config.patternSize, config.viewportSize, ROUND_INWARDS);
	tcu::Surface			viewportSurface			(config.viewportSize.x(), config.viewportSize.y());
	tcu::Surface			errorMask				(config.viewportSize.x(), config.viewportSize.y());
	bool					anyError				= false;

	if (!m_calcPerPrimitiveBBox)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Projected bounding box: (clip space)\n"
				<< "\tx: [" << projectedBBox.min.x() << "," << projectedBBox.max.x() << "]\n"
				<< "\ty: [" << projectedBBox.min.y() << "," << projectedBBox.max.y() << "]\n"
				<< "\tz: [" << projectedBBox.min.z() << "," << projectedBBox.max.z() << "]\n"
			<< "In viewport coordinates:\n"
				<< "\tx: [" << viewportBBoxArea.x() << ", " << viewportBBoxArea.z() << "]\n"
				<< "\ty: [" << viewportBBoxArea.y() << ", " << viewportBBoxArea.w() << "]\n"
			<< "Verifying render results within the bounding box.\n"
			<< tcu::TestLog::EndMessage;
	else
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying render result."
			<< tcu::TestLog::EndMessage;

	if (m_fbo)
		gl.bindFramebuffer(GL_READ_FRAMEBUFFER, **m_fbo);
	glu::readPixels(m_context.getRenderContext(), config.viewportPos.x(), config.viewportPos.y(), viewportSurface.getAccess());

	tcu::clear(errorMask.getAccess(), tcu::IVec4(0,0,0,255));

	for (int y = de::max(viewportBBoxArea.y(), 0); y < de::min(viewportBBoxArea.w(), config.viewportSize.y()); ++y)
	for (int x = de::max(viewportBBoxArea.x(), 0); x < de::min(viewportBBoxArea.z(), config.viewportSize.x()); ++x)
	{
		const tcu::RGBA	pixel		= viewportSurface.getPixel(x, y);
		const bool		outsideGrid	= x < viewportGridOuterArea.x() ||
									  y < viewportGridOuterArea.y() ||
									  x > viewportGridOuterArea.z() ||
									  y > viewportGridOuterArea.w();
		const bool		insideGrid	= x > viewportGridInnerArea.x() &&
									  y > viewportGridInnerArea.y() &&
									  x < viewportGridInnerArea.z() &&
									  y < viewportGridInnerArea.w();

		bool			error		= false;

		if (outsideGrid)
		{
			// expect black
			if (pixel.getRed() != 0 || pixel.getGreen() != 0 || pixel.getBlue() != 0)
				error = true;
		}

		else if (insideGrid)
		{
			// expect green, yellow or a combination of these
			if (pixel.getGreen() != 255 || pixel.getBlue() != 0)
				error = true;
		}
		else
		{
			// boundary, allow anything
		}

		if (error)
		{
			errorMask.setPixel(x, y, tcu::RGBA::red());
			anyError = true;
		}
	}

	if (anyError)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Image verification failed."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Images", "Image verification")
			<< tcu::TestLog::Image("Viewport", "Viewport contents", viewportSurface.getAccess())
			<< tcu::TestLog::Image("ErrorMask", "Error mask", errorMask.getAccess())
			<< tcu::TestLog::EndImageSet;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
	}
	else
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Result image ok."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Images", "Image verification")
			<< tcu::TestLog::Image("Viewport", "Viewport contents", viewportSurface.getAccess())
			<< tcu::TestLog::EndImageSet;
	}
}